

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_(&)[5]>
* __thiscall
Catch::ExprLhs<std::__cxx11::string_const&>::operator==
          (BinaryExpr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_(&)[5]>
           *__return_storage_ptr__,ExprLhs<std::__cxx11::string_const&> *this,char (*rhs) [5])

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs;
  bool comparisonResult;
  StringRef local_30;
  char (*local_20) [5];
  char (*rhs_local) [5];
  ExprLhs<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *this_local;
  
  local_20 = rhs;
  rhs_local = (char (*) [5])this;
  this_local = (ExprLhs<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)__return_storage_ptr__;
  comparisonResult =
       compareEqual<std::__cxx11::string,char[5]>
                 (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this,rhs);
  lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_(&)[5]>
  ::BinaryExpr(__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }